

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O1

Config * flatbuffers::anon_unknown_26::RustDefaultConfig(void)

{
  Config *in_RDI;
  char *__end;
  
  in_RDI->types = kKeep;
  in_RDI->constants = kScreamingSnake;
  in_RDI->methods = kSnake;
  in_RDI->functions = kSnake;
  in_RDI->fields = kKeep;
  in_RDI->variables = kUnknown;
  in_RDI->variants = kKeep;
  (in_RDI->enum_variant_seperator)._M_dataplus._M_p =
       (pointer)&(in_RDI->enum_variant_seperator).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&in_RDI->enum_variant_seperator,"::","")
  ;
  in_RDI->escape_keywords = BeforeConvertingCase;
  in_RDI->namespaces = kSnake;
  (in_RDI->namespace_seperator)._M_dataplus._M_p = (pointer)&(in_RDI->namespace_seperator).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&in_RDI->namespace_seperator,"::","");
  (in_RDI->object_prefix)._M_dataplus._M_p = (pointer)&(in_RDI->object_prefix).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&in_RDI->object_prefix,"");
  (in_RDI->object_suffix)._M_dataplus._M_p = (pointer)&(in_RDI->object_suffix).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&in_RDI->object_suffix,"T","");
  (in_RDI->keyword_prefix)._M_dataplus._M_p = (pointer)&(in_RDI->keyword_prefix).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&in_RDI->keyword_prefix,"");
  (in_RDI->keyword_suffix)._M_dataplus._M_p = (pointer)&(in_RDI->keyword_suffix).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&in_RDI->keyword_suffix,"_","");
  in_RDI->filenames = kSnake;
  in_RDI->directories = kSnake;
  (in_RDI->output_path)._M_dataplus._M_p = (pointer)&(in_RDI->output_path).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&in_RDI->output_path,"");
  (in_RDI->filename_suffix)._M_dataplus._M_p = (pointer)&(in_RDI->filename_suffix).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&in_RDI->filename_suffix,"_generated","");
  (in_RDI->filename_extension)._M_dataplus._M_p = (pointer)&(in_RDI->filename_extension).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&in_RDI->filename_extension,".rs","");
  return in_RDI;
}

Assistant:

static Namer::Config RustDefaultConfig() {
  // Historical note: We've been using "keep" casing since the original
  // implementation, presumably because Flatbuffers schema style and Rust style
  // roughly align. We are not going to enforce proper casing since its an
  // unnecessary breaking change.
  return { /*types=*/Case::kKeep,
           /*constants=*/Case::kScreamingSnake,
           /*methods=*/Case::kSnake,
           /*functions=*/Case::kSnake,
           /*fields=*/Case::kKeep,
           /*variables=*/Case::kUnknown,  // Unused.
           /*variants=*/Case::kKeep,
           /*enum_variant_seperator=*/"::",
           /*escape_keywords=*/Namer::Config::Escape::BeforeConvertingCase,
           /*namespaces=*/Case::kSnake,
           /*namespace_seperator=*/"::",
           /*object_prefix=*/"",
           /*object_suffix=*/"T",
           /*keyword_prefix=*/"",
           /*keyword_suffix=*/"_",
           /*filenames=*/Case::kSnake,
           /*directories=*/Case::kSnake,
           /*output_path=*/"",
           /*filename_suffix=*/"_generated",
           /*filename_extension=*/".rs" };
}